

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

bool __thiscall SQClosure::Save(SQClosure *this,SQVM *v,SQUserPointer up,SQWRITEFUNC write)

{
  bool bVar1;
  SQInteger SVar2;
  undefined4 local_2c;
  
  local_2c = 0x53514952;
  SVar2 = (*write)(up,&local_2c,4);
  if (SVar2 == 4) {
    local_2c = 1;
    SVar2 = (*write)(up,&local_2c,4);
    if (SVar2 == 4) {
      local_2c = 8;
      SVar2 = (*write)(up,&local_2c,4);
      if (SVar2 == 4) {
        local_2c = 4;
        SVar2 = (*write)(up,&local_2c,4);
        if (SVar2 == 4) {
          bVar1 = SQFunctionProto::Save(this->_function,v,up,write);
          if (!bVar1) {
            return false;
          }
          local_2c = 0x5441494c;
          SVar2 = (*write)(up,&local_2c,4);
          bVar1 = SVar2 == 4;
          if (bVar1) {
            return bVar1;
          }
          goto LAB_0012311e;
        }
      }
    }
  }
  bVar1 = false;
LAB_0012311e:
  SQVM::Raise_Error(v,"io error (write function failure)");
  return bVar1;
}

Assistant:

bool SQClosure::Save(SQVM *v,SQUserPointer up,SQWRITEFUNC write)
{
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_HEAD));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQChar)));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQInteger)));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQFloat)));
    _CHECK_IO(_function->Save(v,up,write));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_TAIL));
    return true;
}